

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer
          (ConversionStream *this,iterator *Token,Uint32 *ShaderStorageBlockBinding)

{
  TokenListType *this_00;
  _List_node_base *p_Var1;
  const_iterator cVar2;
  iterator iVar3;
  int iVar4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  long *plVar7;
  char (*in_RCX) [97];
  long *plVar8;
  size_type *psVar9;
  String NameRedefine;
  string msg;
  __string_type __str;
  String local_398;
  undefined1 local_378 [16];
  undefined1 local_368 [9];
  undefined7 uStack_35f;
  undefined8 uStack_358;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  size_t local_330;
  ios_base local_2f8 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  char *local_1b0;
  size_type local_1a8;
  char local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  char *local_170;
  size_type local_168;
  char local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  char *local_130;
  size_type local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  char *local_f0;
  size_type local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  char *local_b0;
  size_type local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  char *local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  iVar4 = *(int *)&Token->_M_node[1]._M_next;
  if ((iVar4 != 0x105) && (iVar4 != 0x116)) {
    FormatString<char[26],char[97]>
              ((string *)local_378,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer"
               ,in_RCX);
    DebugAssertionFailed
              ((Char *)local_378._0_8_,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3d9);
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  p_Var1 = Token->_M_node;
  if (*(int *)&p_Var1[1]._M_next == 0x105) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_378);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_368,"layout(binding=",0xf);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_368);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,") buffer",8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&Token->_M_node[1]._M_prev,(string *)&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    *ShaderStorageBlockBinding = *ShaderStorageBlockBinding + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_378);
    std::ios_base::~ios_base(local_2f8);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&p_Var1[1]._M_prev,0,(char *)p_Var1[2]._M_next,0x34411b)
    ;
  }
  p_Var1 = Token->_M_node->_M_next;
  Token->_M_node = p_Var1;
  this_00 = &this->m_Tokens;
  if (p_Var1 == (_List_node_base *)this_00) {
    FormatString<char[48]>
              ((string *)local_378,
               (char (*) [48])"Unexpected EOF after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3e9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
  if (iVar4 != 0) {
    FormatString<char[46]>
              ((string *)local_378,
               (char (*) [46])"\'<\' expected after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&Token->_M_node[1]._M_prev,0,(char *)Token->_M_node[2]._M_next,0x344189);
  cVar2._M_node = Token->_M_node;
  *(undefined4 *)&cVar2._M_node[1]._M_next = 0x133;
  p_Var1 = (cVar2._M_node)->_M_next;
  Token->_M_node = p_Var1;
  if (p_Var1 == (_List_node_base *)this_00) {
    FormatString<char[21]>((string *)local_378,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3f4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  iVar4 = *(int *)&Token->_M_node[1]._M_next;
  if (0xbe < iVar4 - 1U && iVar4 != 0x13b) {
    FormatString<char[72]>
              ((string *)local_378,
               (char (*) [72])
               "Identifier or built-in type is expected in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3f5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  p_Var1 = Token->_M_node->_M_next;
  Token->_M_node = p_Var1;
  if (p_Var1 == (_List_node_base *)this_00) {
    FormatString<char[47]>
              ((string *)local_378,(char (*) [47])"Unexpected EOF in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fa,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
  if (iVar4 != 0) {
    FormatString<char[35]>
              ((string *)local_378,(char (*) [35])"\'>\' expected after type definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  iVar3 = (iterator)Token->_M_node;
  Token->_M_node = (iVar3._M_node)->_M_next;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_erase(this_00,iVar3);
  if (Token->_M_node == (_List_node_base *)this_00) {
    FormatString<char[21]>((string *)local_378,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x401,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  if (*(int *)&Token->_M_node[1]._M_next != 0x13b) {
    FormatString<char[52]>
              ((string *)local_378,
               (char (*) [52])"Identifier expected in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x402,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  if (Token->_M_node[4]._M_next == (_List_node_base *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&Token->_M_node[3]._M_prev,0,(char *)0x0,0x344d19);
  }
  std::__cxx11::string::string
            ((string *)&local_90,(char *)Token->_M_node[1]._M_prev,(allocator *)&local_398);
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
  local_378._8_8_ = local_368 + 8;
  local_378._0_4_ = 0x13b;
  if (local_90 == &local_80) {
    uStack_358 = uStack_78;
  }
  else {
    local_378._8_8_ = local_90;
  }
  uStack_35f = uStack_7f;
  local_368[8] = local_80;
  local_350._M_p = (pointer)&local_340;
  local_368._0_8_ = local_88;
  local_88 = 0;
  local_80 = '\0';
  if (local_d0 == &local_c0) {
    local_340._8_8_ = local_c0._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_d0;
  }
  local_340._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_c0._M_local_buf[0];
  local_348 = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_d0 = &local_c0;
  local_90 = &local_80;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  p_Var1 = Token->_M_node;
  p_Var6 = p_Var1->_M_next;
  Token->_M_node = p_Var6;
  iVar4 = std::__cxx11::string::compare((char *)&p_Var6[1]._M_prev);
  p_Var6 = Token->_M_node;
  if (p_Var6 != (_List_node_base *)this_00 && iVar4 == 0) {
    do {
      if (*(int *)&p_Var6[1]._M_next == 0x13e) break;
      iVar3 = (iterator)Token->_M_node;
      Token->_M_node = (iVar3._M_node)->_M_next;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      _M_erase(this_00,iVar3);
      p_Var6 = Token->_M_node;
    } while (p_Var6 != (_List_node_base *)this_00);
  }
  if (Token->_M_node == (_List_node_base *)this_00) {
    FormatString<char[21]>((string *)local_378,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x421,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  if (*(int *)&Token->_M_node[1]._M_next != 0x13e) {
    FormatString<char[13]>((string *)local_378,(char (*) [13])"\';\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_398,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x422,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378
               ,(char (*) [2])0x33bd33,&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_378._0_8_ != local_368) {
      operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
    }
  }
  cVar2._M_node = Token->_M_node;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"[","");
  local_110 = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_378._0_4_ = 0x137;
  local_378._8_8_ = local_368 + 8;
  if (local_f0 == &local_e0) {
    uStack_358 = uStack_d8;
  }
  else {
    local_378._8_8_ = local_f0;
  }
  uStack_35f = uStack_df;
  local_368[8] = local_e0;
  local_368._0_8_ = local_e8;
  local_e8 = 0;
  local_e0 = '\0';
  local_350._M_p = (pointer)&local_340;
  if (local_110 == &local_100) {
    local_340._8_8_ = local_100._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_110;
  }
  local_340._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_100._M_local_buf[0];
  local_348 = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_110 = &local_100;
  local_f0 = &local_e0;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  cVar2._M_node = Token->_M_node;
  local_130 = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"]","");
  local_150 = &local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  local_378._0_4_ = 0x138;
  local_378._8_8_ = local_368 + 8;
  if (local_130 == &local_120) {
    uStack_358 = uStack_118;
  }
  else {
    local_378._8_8_ = local_130;
  }
  uStack_35f = uStack_11f;
  local_368[8] = local_120;
  local_368._0_8_ = local_128;
  local_128 = 0;
  local_120 = '\0';
  local_350._M_p = (pointer)&local_340;
  if (local_150 == &local_140) {
    local_340._8_8_ = local_140._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_150;
  }
  local_340._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_140._M_local_buf[0];
  local_348 = local_148;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_150 = &local_140;
  local_130 = &local_120;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,
                    CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  cVar2._M_node = Token->_M_node;
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,";","");
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  local_378._0_4_ = 0x13e;
  local_378._8_8_ = local_368 + 8;
  if (local_170 == &local_160) {
    uStack_358 = uStack_158;
  }
  else {
    local_378._8_8_ = local_170;
  }
  uStack_35f = uStack_15f;
  local_368[8] = local_160;
  local_368._0_8_ = local_168;
  local_168 = 0;
  local_160 = '\0';
  local_350._M_p = (pointer)&local_340;
  if (local_190 == &local_180) {
    local_340._8_8_ = local_180._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_190;
  }
  local_340._M_allocated_capacity._1_7_ = local_180._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_180._M_local_buf[0];
  local_348 = local_188;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_190 = &local_180;
  local_170 = &local_160;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,
                    CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  cVar2._M_node = Token->_M_node;
  local_1b0 = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"}","");
  local_1d0 = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  local_378._0_4_ = 0x134;
  local_378._8_8_ = local_368 + 8;
  if (local_1b0 == &local_1a0) {
    uStack_358 = uStack_198;
  }
  else {
    local_378._8_8_ = local_1b0;
  }
  uStack_35f = uStack_19f;
  local_368[8] = local_1a0;
  local_368._0_8_ = local_1a8;
  local_1a8 = 0;
  local_1a0 = '\0';
  local_350._M_p = (pointer)&local_340;
  if (local_1d0 == &local_1c0) {
    local_340._8_8_ = local_1c0._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_1d0;
  }
  local_340._M_allocated_capacity._1_7_ = local_1c0._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_1c0._M_local_buf[0];
  local_348 = local_1c8;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_1d0 = &local_1c0;
  local_1b0 = &local_1a0;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  Token->_M_node = Token->_M_node->_M_next;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"#define ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,p_Var1[1]._M_prev,
             (long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var1[2]._M_next);
  std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)p_Var1[1]._M_prev);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_368._0_8_ = *psVar9;
    unique0x10000ee1 = plVar7[3];
    local_378._0_8_ = local_368;
  }
  else {
    local_368._0_8_ = *psVar9;
    local_378._0_8_ = (size_type *)*plVar7;
  }
  local_378._8_8_ = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_398,local_378._0_8_);
  if ((undefined1 *)local_378._0_8_ != local_368) {
    operator_delete((void *)local_378._0_8_,local_368._0_8_ + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  cVar2._M_node = Token->_M_node;
  std::__cxx11::string::string
            ((string *)&local_b0,local_398._M_dataplus._M_p,(allocator *)&local_50);
  local_1f0 = &local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\r\n","");
  local_378._0_4_ = 0x143;
  local_378._8_8_ = local_368 + 8;
  if (local_b0 == &local_a0) {
    uStack_358 = uStack_98;
  }
  else {
    local_378._8_8_ = local_b0;
  }
  uStack_35f = uStack_9f;
  local_368[8] = local_a0;
  local_368._0_8_ = local_a8;
  local_a8 = 0;
  local_a0 = '\0';
  local_350._M_p = (pointer)&local_340;
  if (local_1f0 == &local_1e0) {
    local_340._8_8_ = local_1e0._8_8_;
  }
  else {
    local_350._M_p = (pointer)local_1f0;
  }
  local_340._M_allocated_capacity._1_7_ = local_1e0._M_allocated_capacity._1_7_;
  local_340._M_local_buf[0] = local_1e0._M_local_buf[0];
  local_348 = local_1e8;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_330 = 0xffffffffffffffff;
  local_1f0 = &local_1e0;
  local_b0 = &local_a0;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar2,(HLSLTokenInfo *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_p != &local_340) {
    operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_378._8_8_ != local_368 + 8) {
    operator_delete((void *)local_378._8_8_,stack0xfffffffffffffca0 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,
                    CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  std::__cxx11::string::append((char *)&p_Var1[1]._M_prev);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer(TokenListType::iterator& Token, Uint32& ShaderStorageBlockBinding)
{
    // StructuredBuffer<DataType> g_Data;
    // ^
    VERIFY_EXPR(Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer);
    if (Token->Type == TokenType::kw_RWStructuredBuffer)
    {
        std::stringstream ss;
        ss << "layout(binding=" << ShaderStorageBlockBinding << ") buffer";
        Token->Literal = ss.str();
        ++ShaderStorageBlockBinding;
    }
    else
        Token->Literal = "readonly buffer";
    // buffer<DataType> g_Data;
    // ^

    ++Token;
    // buffer<DataType> g_Data;
    //       ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"StructuredBuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Literal == "<", "\'<\' expected after \"StructuredBuffer\" keyword");
    Token->Literal = "{";
    Token->Type    = TokenType::OpenBrace;
    // buffer{DataType> g_Data;
    //       ^
    auto OpenBraceToken = Token;

    ++Token;
    // buffer{DataType> g_Data;
    //        ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier || Token->IsBuiltInType(), "Identifier or built-in type is expected in Structured Buffer definition");

    ++Token;
    // buffer{DataType> g_Data;
    //                ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in Structured Buffer definition");
    VERIFY_PARSER_STATE(Token, Token->Literal == ">", "\'>\' expected after type definition");
    auto ClosingAngleBracketTkn = Token;
    ++Token;
    m_Tokens.erase(ClosingAngleBracketTkn);
    // buffer{DataType g_Data;
    //                 ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in Structured Buffer definition");
    if (Token->Delimiter.empty())
        Token->Delimiter = " ";

    m_Tokens.insert(OpenBraceToken, TokenInfo(TokenType::Identifier, Token->Literal.c_str(), " "));
    //          OpenBraceToken
    //              V
    // buffer g_Data{DataType g_Data;
    //                        ^
    auto GlobalVarNameToken = Token;

    ++Token;
    // buffer g_Data{DataType g_Data;
    //                              ^

    if (Token->Literal == ":")
    {
        // buffer g_Data{DataType g_Data : register(t0);
        //                               ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::Semicolon)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }

        // buffer g_Data{DataType g_Data ;
        //                               ^
    }
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Semicolon, "\';\' expected");

    m_Tokens.insert(Token, TokenInfo(TokenType::OpenSquareBracket, "["));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingSquareBracket, "]"));
    m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingBrace, "}"));
    // buffer g_Data{DataType g_Data[]};
    //                                 ^
    ++Token;
    String NameRedefine("#define ");
    NameRedefine += GlobalVarNameToken->Literal + ' ' + GlobalVarNameToken->Literal + "_data\r\n";
    m_Tokens.insert(Token, TokenInfo(TokenType::TextBlock, NameRedefine.c_str(), "\r\n"));
    GlobalVarNameToken->Literal.append("_data");
    // buffer g_Data{DataType g_Data_data[]};
    // #define g_Data g_Data_data
    //                           ^
}